

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

bool nite::keyboardPressed(uint key)

{
  bool local_9;
  uint key_local;
  
  if (key < 0x65) {
    if ((isKeysStatePressed[key] & 1U) == 0) {
      if (((KeysStatePressed[key] & 1U) == 0) || ((KeysState[key] & 1U) == 0)) {
        if ((KeysStatePressed[key] & 1U) == 0) {
          if (((KeysStatePressed[key] & 1U) == 0) && ((KeysState[key] & 1U) != 0)) {
            isKeysStatePressed[key] = true;
            KeysStatePressed[key] = true;
            local_9 = true;
          }
          else {
            local_9 = false;
          }
        }
        else {
          KeysStatePressed[key] = false;
          local_9 = false;
        }
      }
      else {
        local_9 = false;
      }
    }
    else {
      local_9 = true;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool nite::keyboardPressed(unsigned key){
	if (key >= niteKeysn){
		return 0;
	}

	if (isKeysStatePressed[key]){
		return 1;
	}

	if (KeysStatePressed[key] and KeysState[key]){
		return 0;
	}

	if (KeysStatePressed[key]){
		KeysStatePressed[key] = 0;
		return 0;
	}

	if (!KeysStatePressed[key] and KeysState[key]){
		isKeysStatePressed[key] = 1;
		KeysStatePressed[key] = 1;
		return 1;
	}

	return 0;
}